

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O1

string_t __thiscall
duckdb::URLDecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (URLDecodeOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  string_t result_str;
  uint local_38;
  undefined4 uStack_34;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  uVar3 = (ulong)this & 0xffffffff;
  pcVar5 = (char *)((long)&local_28 + 4);
  if (0xc < uVar3) {
    pcVar5 = local_20;
  }
  local_28 = this;
  uVar2 = duckdb::StringUtil::URLDecodeSize(pcVar5,uVar3,false);
  auVar6 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  local_30 = auVar6._8_8_;
  local_38 = auVar6._0_4_;
  uStack_34 = auVar6._4_4_;
  pcVar4 = local_30;
  if (local_38 < 0xd) {
    pcVar4 = (char *)&uStack_34;
  }
  duckdb::StringUtil::URLDecodeBuffer(pcVar5,uVar3,pcVar4,false);
  uVar3 = auVar6._0_8_ & 0xffffffff;
  if (uVar3 < 0xd) {
    memset((char *)((long)&uStack_34 + uVar3),0,0xc - uVar3);
  }
  else {
    uStack_34 = *(undefined4 *)local_30;
  }
  aVar1._4_1_ = (undefined1)uStack_34;
  aVar1._5_1_ = uStack_34._1_1_;
  aVar1._6_1_ = uStack_34._2_1_;
  aVar1._7_1_ = uStack_34._3_1_;
  aVar1.pointer.length = local_38;
  aVar1.pointer.ptr = local_30;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLDecodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLDecodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}